

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::LogMessage::Init
          (LogMessage *this,char *file,int line,LogSeverity severity,SendMethod send_method)

{
  _func_int *p_Var1;
  long lVar2;
  int iVar3;
  undefined1 *puVar4;
  LogMessageData *pLVar5;
  int *piVar6;
  char *pcVar7;
  ostream *poVar8;
  long *this_00;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  WallTime WVar9;
  string stacktrace;
  char fileline [128];
  
  this->allocated_ = (LogMessageData *)0x0;
  if ((severity == 3) && (exit_on_dfatal != '\0')) {
    ::glog_internal_namespace_::Mutex::Lock((Mutex *)fatal_msg_lock);
    if (fatal_msg_exclusive == '\0') {
      fatal_msg_exclusive = '\x01';
      fatal_msg_data_exclusive[0x7721] = 1;
      puVar4 = fatal_msg_data_exclusive;
    }
    else {
      DAT_00140a39 = 0;
      puVar4 = (undefined1 *)&fatal_msg_data_shared;
    }
    this->data_ = (LogMessageData *)puVar4;
    ::glog_internal_namespace_::Mutex::Unlock((Mutex *)fatal_msg_lock);
    pLVar5 = this->data_;
  }
  else {
    lVar2 = *in_FS_OFFSET;
    if (*(char *)(lVar2 + -0x7730) == '\x01') {
      *(undefined1 *)(lVar2 + -0x7730) = 0;
      pLVar5 = (LogMessageData *)(lVar2 + -0x7728);
      LogMessageData::LogMessageData(pLVar5);
    }
    else {
      pLVar5 = (LogMessageData *)operator_new(0x7728);
      LogMessageData::LogMessageData(pLVar5);
      this->allocated_ = pLVar5;
    }
    this->data_ = pLVar5;
    pLVar5->first_fatal_ = false;
  }
  p_Var1 = (pLVar5->stream_).super_ostream._vptr_basic_ostream[-3];
  std::ios::fill();
  (p_Var1 + 0xe0)[(long)&(pLVar5->stream_).super_ostream._vptr_basic_ostream] = (code)0x30;
  piVar6 = __errno_location();
  pLVar5 = this->data_;
  pLVar5->preserved_errno_ = *piVar6;
  pLVar5->severity_ = (char)severity;
  pLVar5->line_ = line;
  pLVar5->send_method_ = send_method;
  *(undefined8 *)&pLVar5->field_0x76a8 = in_R9;
  (pLVar5->field_6).sink_ = (LogSink *)0x0;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  WVar9 = glog_internal_namespace_::WallTime_Now();
  pLVar5 = this->data_;
  pLVar5->timestamp_ = (long)WVar9;
  localtime_r(&pLVar5->timestamp_,(tm *)&pLVar5->tm_time_);
  pLVar5 = this->data_;
  lVar2 = pLVar5->timestamp_;
  pLVar5->num_chars_to_log_ = 0;
  pLVar5->num_chars_to_syslog_ = 0;
  pcVar7 = glog_internal_namespace_::const_basename(file);
  pLVar5 = this->data_;
  pLVar5->basename_ = pcVar7;
  pLVar5->fullname_ = file;
  pLVar5->has_been_flushed_ = false;
  if ((line != -1) && (fLB::FLAGS_log_prefix != '\0')) {
    poVar8 = std::operator<<(&(pLVar5->stream_).super_ostream,
                             **(char **)(LogSeverityNames + (long)severity * 8));
    *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 2;
    this_00 = (long *)std::ostream::operator<<(poVar8,(this->data_->tm_time_).tm_mon + 1);
    *(undefined8 *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x10) = 2;
    poVar8 = (ostream *)std::ostream::operator<<(this_00,(this->data_->tm_time_).tm_mday);
    poVar8 = std::operator<<(poVar8,' ');
    *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 2;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->data_->tm_time_).tm_hour);
    poVar8 = std::operator<<(poVar8,':');
    *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 2;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->data_->tm_time_).tm_min);
    poVar8 = std::operator<<(poVar8,':');
    *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 2;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->data_->tm_time_).tm_sec);
    poVar8 = std::operator<<(poVar8,".");
    *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 6;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)((WVar9 - (double)lVar2) * 1000000.0));
    poVar8 = std::operator<<(poVar8,' ');
    poVar8 = std::operator<<(poVar8,0x20);
    *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 5;
    glog_internal_namespace_::GetTID();
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,0x30);
    std::operator<<(poVar8,' ');
    pLVar5 = this->data_;
  }
  pLVar5->num_prefix_chars_ =
       *(long *)&(pLVar5->stream_).super_ostream.field_0x30 -
       *(long *)&(pLVar5->stream_).super_ostream.field_0x28;
  if (fLS::FLAGS_log_backtrace_at_abi_cxx11_[1] != 0) {
    snprintf(fileline,0x80,"%s:%d",pLVar5->basename_,(ulong)(uint)line);
    iVar3 = strcmp((char *)*fLS::FLAGS_log_backtrace_at_abi_cxx11_,fileline);
    if (iVar3 == 0) {
      stacktrace._M_dataplus._M_p = (pointer)&stacktrace.field_2;
      stacktrace._M_string_length = 0;
      stacktrace.field_2._M_local_buf[0] = '\0';
      glog_internal_namespace_::DumpStackTraceToString(&stacktrace);
      poVar8 = std::operator<<(&(this->data_->stream_).super_ostream," (stacktrace:\n");
      poVar8 = std::operator<<(poVar8,(string *)&stacktrace);
      std::operator<<(poVar8,") ");
      std::__cxx11::string::~string((string *)&stacktrace);
    }
  }
  return;
}

Assistant:

void LogMessage::Init(const char* file,
                      int line,
                      LogSeverity severity,
                      void (LogMessage::*send_method)()) {
  allocated_ = NULL;
  if (severity != GLOG_FATAL || !exit_on_dfatal) {
#ifdef GLOG_THREAD_LOCAL_STORAGE
    // No need for locking, because this is thread local.
    if (thread_data_available) {
      thread_data_available = false;
#ifdef HAVE_ALIGNED_STORAGE
      data_ = new (&thread_msg_data) LogMessageData;
#else
      const uintptr_t kAlign = sizeof(void*) - 1;

      char* align_ptr =
          reinterpret_cast<char*>(reinterpret_cast<uintptr_t>(thread_msg_data + kAlign) & ~kAlign);
      data_ = new (align_ptr) LogMessageData;
      assert(reinterpret_cast<uintptr_t>(align_ptr) % sizeof(void*) == 0);
#endif
    } else {
      allocated_ = new LogMessageData();
      data_ = allocated_;
    }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
    allocated_ = new LogMessageData();
    data_ = allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
    data_->first_fatal_ = false;
  } else {
    MutexLock l(&fatal_msg_lock);
    if (fatal_msg_exclusive) {
      fatal_msg_exclusive = false;
      data_ = &fatal_msg_data_exclusive;
      data_->first_fatal_ = true;
    } else {
      data_ = &fatal_msg_data_shared;
      data_->first_fatal_ = false;
    }
  }

  stream().fill('0');
  data_->preserved_errno_ = errno;
  data_->severity_ = severity;
  data_->line_ = line;
  data_->send_method_ = send_method;
  data_->sink_ = NULL;
  data_->outvec_ = NULL;
  WallTime now = WallTime_Now();
  data_->timestamp_ = static_cast<time_t>(now);
  localtime_r(&data_->timestamp_, &data_->tm_time_);
  int usecs = static_cast<int>((now - data_->timestamp_) * 1000000);

  data_->num_chars_to_log_ = 0;
  data_->num_chars_to_syslog_ = 0;
  data_->basename_ = const_basename(file);
  data_->fullname_ = file;
  data_->has_been_flushed_ = false;

  // If specified, prepend a prefix to each line.  For example:
  //    I1018 160715 f5d4fbb0 logging.cc:1153]
  //    (log level, GMT month, date, time, thread_id, file basename, line)
  // We exclude the thread_id for the default thread.
  if (FLAGS_log_prefix && (line != kNoLogPrefix)) {
    stream() << LogSeverityNames[severity][0]
             << setw(2) << 1+data_->tm_time_.tm_mon
             << setw(2) << data_->tm_time_.tm_mday
             << ' '
             << setw(2) << data_->tm_time_.tm_hour  << ':'
             << setw(2) << data_->tm_time_.tm_min   << ':'
             << setw(2) << data_->tm_time_.tm_sec   << "."
             << setw(6) << usecs
             << ' '
             << setfill(' ') << setw(5)
             << static_cast<unsigned int>(GetTID()) << setfill('0')
             << ' ';
             // @huihut delete file & line
            //  << data_->basename_ << ':' << data_->line_ << "] ";
  }
  data_->num_prefix_chars_ = data_->stream_.pcount();

  if (!FLAGS_log_backtrace_at.empty()) {
    char fileline[128];
    snprintf(fileline, sizeof(fileline), "%s:%d", data_->basename_, line);
#ifdef HAVE_STACKTRACE
    if (!strcmp(FLAGS_log_backtrace_at.c_str(), fileline)) {
      string stacktrace;
      DumpStackTraceToString(&stacktrace);
      stream() << " (stacktrace:\n" << stacktrace << ") ";
    }
#endif
  }
}